

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

bool __thiscall
UdpSocketImpl::Create(UdpSocketImpl *this,char *szIpToWhere,uint16_t sPort,char *szIpToBind)

{
  int32_t *piVar1;
  UdpSocketImpl *pUVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int __val;
  undefined6 in_register_00000012;
  bool bVar6;
  addrinfo *lstBind;
  addrinfo *lstAddr;
  UdpSocketImpl *local_98;
  uint32_t on;
  size_type local_88;
  UdpSocketImpl *local_70;
  addrinfo local_68;
  
  __val = (int)CONCAT62(in_register_00000012,sPort);
  lstAddr = (addrinfo *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_socktype = 2;
  local_68.ai_protocol = 0;
  local_68.ai_flags = 1;
  local_68.ai_family = 0;
  local_98 = this;
  std::__cxx11::to_string((string *)&on,__val);
  iVar3 = getaddrinfo(szIpToWhere,(char *)_on,&local_68,(addrinfo **)&lstAddr);
  std::__cxx11::string::~string((string *)&on);
  if (iVar3 == 0) {
    iVar3 = socket(lstAddr->ai_family,lstAddr->ai_socktype,lstAddr->ai_protocol);
    pUVar2 = local_98;
    piVar1 = &(local_98->super_BaseSocketImpl).m_fSock;
    (local_98->super_BaseSocketImpl).m_fSock = iVar3;
    if (iVar3 == -1) {
LAB_001185e7:
      piVar4 = (int *)__cxa_allocate_exception(4);
      piVar5 = __errno_location();
      *piVar4 = *piVar5;
      __cxa_throw(piVar4,&int::typeinfo,0);
    }
    (*(local_98->super_BaseSocketImpl)._vptr_BaseSocketImpl[0xe])(local_98,piVar1);
    if (lstAddr->ai_family == 10) {
      _on = (code *)((ulong)_on & 0xffffffff00000000);
      iVar3 = setsockopt(*piVar1,0x29,0x1a,&on,4);
      if (iVar3 == -1) {
        piVar4 = (int *)__cxa_allocate_exception(4);
        piVar5 = __errno_location();
        *piVar4 = *piVar5;
        __cxa_throw(piVar4,&int::typeinfo,0);
      }
    }
    if (szIpToBind == (char *)0x0) {
      iVar3 = bind(*piVar1,(sockaddr *)lstAddr->ai_addr,lstAddr->ai_addrlen);
      if (iVar3 < 0) goto LAB_001185e7;
    }
    else {
      std::__cxx11::to_string((string *)&on,__val);
      iVar3 = getaddrinfo(szIpToBind,(char *)_on,(addrinfo *)0x0,(addrinfo **)&lstBind);
      std::__cxx11::string::~string((string *)&on);
      if (iVar3 != 0) {
LAB_0011850e:
        piVar4 = (int *)__cxa_allocate_exception(4);
        piVar5 = __errno_location();
        *piVar4 = *piVar5;
        __cxa_throw(piVar4,&int::typeinfo,0);
      }
      iVar3 = bind(*piVar1,(sockaddr *)lstBind->ai_addr,lstBind->ai_addrlen);
      freeaddrinfo((addrinfo *)lstBind);
      if (iVar3 < 0) goto LAB_0011850e;
    }
    _on = SelectThread;
    local_88 = 0;
    local_70 = pUVar2;
    std::thread::thread<void(UdpSocketImpl::*)(),UdpSocketImpl*,void>
              ((thread *)&lstBind,(type *)&on,&local_70);
    std::thread::operator=(&(pUVar2->super_BaseSocketImpl).m_thListen,(thread *)&lstBind);
    std::thread::~thread((thread *)&lstBind);
    _on = WriteThread;
    local_88 = 0;
    local_70 = pUVar2;
    std::thread::thread<void(UdpSocketImpl::*)(),UdpSocketImpl*,void>
              ((thread *)&lstBind,(type *)&on,&local_70);
    std::thread::operator=(&(pUVar2->super_BaseSocketImpl).m_thWrite,(thread *)&lstBind);
    std::thread::~thread((thread *)&lstBind);
    bVar6 = true;
    freeaddrinfo((addrinfo *)lstAddr);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool UdpSocketImpl::Create(const char* const szIpToWhere, const uint16_t sPort, const char* const szIpToBind/* = nullptr*/)
{
    struct addrinfo* lstAddr{}, hint{};
    hint.ai_family = AF_UNSPEC;
    hint.ai_socktype = SOCK_DGRAM;
    hint.ai_flags = AI_PASSIVE;

    if (::getaddrinfo(szIpToWhere, to_string(sPort).c_str(), &hint, &lstAddr) != 0)
        return false;

    bool bRet = true;

    try
    {
        m_fSock = ::socket(lstAddr->ai_family, lstAddr->ai_socktype, lstAddr->ai_protocol);
        if (m_fSock == INVALID_SOCKET)
            throw WSAGetLastError();

        SetSocketOption(m_fSock);

        if (lstAddr->ai_family == AF_INET6)
        {
            constexpr uint32_t on = 0;
            if (::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_V6ONLY, reinterpret_cast<const char*>(&on), sizeof(on)) == -1)
                throw WSAGetLastError();
        }

        if (szIpToBind != nullptr)
        {
            struct addrinfo *lstBind;
            if (::getaddrinfo(szIpToBind, to_string(sPort).c_str(), nullptr, &lstBind) != 0)
                throw WSAGetLastError();

            if (::bind(m_fSock, lstBind->ai_addr, static_cast<int>(lstBind->ai_addrlen)) < 0)
            {
                ::freeaddrinfo(lstBind);
                throw WSAGetLastError();
            }
            ::freeaddrinfo(lstBind);
        }
        else
        {
            if (::bind(m_fSock, lstAddr->ai_addr, static_cast<int>(lstAddr->ai_addrlen)) < 0)
                throw WSAGetLastError();
        }

        m_thListen = thread(&UdpSocketImpl::SelectThread, this);
        m_thWrite = thread(&UdpSocketImpl::WriteThread, this);
    }

    catch (const int iSocketErr)
    {
        m_iError = iSocketErr;
        m_iErrLoc = 1;
        if (m_fSock != INVALID_SOCKET)
            ::closesocket(m_fSock);
        m_fSock = INVALID_SOCKET;

        bRet = false;
    }

    ::freeaddrinfo(lstAddr);

    return bRet;
}